

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall glslang::TGlslIoMapper::TGlslIoMapper(TGlslIoMapper *this)

{
  TGlslIoMapper *this_local;
  
  TIoMapper::TIoMapper(&this->super_TIoMapper);
  (this->super_TIoMapper)._vptr_TIoMapper = (_func_int **)&PTR__TGlslIoMapper_010dd770;
  this->hadError = false;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->autoPushConstantBlockName);
  memset(this->inVarMaps,0,0x70);
  memset(this->outVarMaps,0,0x70);
  memset(this->uniformVarMap,0,0x70);
  memset(this->intermediates,0,0x70);
  this->profile = ENoProfile;
  this->version = 0;
  this->autoPushConstantMaxSize = 0x80;
  this->autoPushConstantBlockPacking = ElpStd430;
  return;
}

Assistant:

TGlslIoMapper::TGlslIoMapper() {
    memset(inVarMaps,     0, sizeof(TVarLiveMap*)   * EShLangCount);
    memset(outVarMaps,    0, sizeof(TVarLiveMap*)   * EShLangCount);
    memset(uniformVarMap, 0, sizeof(TVarLiveMap*)   * EShLangCount);
    memset(intermediates, 0, sizeof(TIntermediate*) * EShLangCount);
    profile = ENoProfile;
    version = 0;
    autoPushConstantMaxSize = 128;
    autoPushConstantBlockPacking = ElpStd430;
}